

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fIntegerStateQueryTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::anon_unknown_2::StencilOpTestCase::SetStencilOp
          (StencilOpTestCase *this,GLenum stencilOpValue)

{
  GLenum GVar1;
  
  GVar1 = this->m_stencilOpName;
  if ((int)GVar1 < 0x8801) {
    if (GVar1 == 0xb94) {
LAB_01219f65:
      GVar1 = 0x1e00;
      goto LAB_01219f90;
    }
    if (GVar1 != 0xb95) {
      if (GVar1 != 0xb96) {
        return;
      }
      goto LAB_01219f72;
    }
  }
  else {
    if (GVar1 == 0x8803) {
LAB_01219f72:
      glu::CallLogWrapper::glStencilOp
                (&(this->super_ApiCase).super_CallLogWrapper,0x1e00,0x1e00,stencilOpValue);
      return;
    }
    if (GVar1 != 0x8802) {
      if (GVar1 != 0x8801) {
        return;
      }
      goto LAB_01219f65;
    }
  }
  GVar1 = stencilOpValue;
  stencilOpValue = 0x1e00;
LAB_01219f90:
  glu::CallLogWrapper::glStencilOp
            (&(this->super_ApiCase).super_CallLogWrapper,stencilOpValue,GVar1,0x1e00);
  return;
}

Assistant:

virtual void SetStencilOp (GLenum stencilOpValue)
	{
		switch (m_stencilOpName)
		{
		case GL_STENCIL_FAIL:
		case GL_STENCIL_BACK_FAIL:
			glStencilOp(stencilOpValue, GL_KEEP, GL_KEEP);
			break;

		case GL_STENCIL_PASS_DEPTH_FAIL:
		case GL_STENCIL_BACK_PASS_DEPTH_FAIL:
			glStencilOp(GL_KEEP, stencilOpValue, GL_KEEP);
			break;

		case GL_STENCIL_PASS_DEPTH_PASS:
		case GL_STENCIL_BACK_PASS_DEPTH_PASS:
			glStencilOp(GL_KEEP, GL_KEEP, stencilOpValue);
			break;

		default:
			DE_ASSERT(false && "should not happen");
			break;
		}
	}